

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void none_partition_search
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MACROBLOCK *x,
               PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,
               RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,uint *pb_source_variance,int64_t *none_rd,int64_t *part_none_rd)

{
  RD_STATS best_rd;
  int8_t iVar1;
  int *pt_cost_00;
  MACROBLOCK *in_RCX;
  long in_RDI;
  undefined1 *in_R8;
  long in_stack_00000010;
  void *in_stack_00000018;
  PartitionSearchState *in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined8 *in_stack_00000030;
  int ref_type;
  RD_STATS best_remain_rdcost;
  int pt_cost;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  RD_STATS *this_rdc;
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  void *pvVar2;
  PartitionSearchState *part_state;
  undefined4 uVar3;
  MACROBLOCKD *xd;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  PartitionSearchState *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  MACROBLOCK *in_stack_ffffffffffffff60;
  MACROBLOCK *sms_tree_00;
  ThreadData_conflict *in_stack_ffffffffffffff68;
  ThreadData_conflict *x_00;
  AV1_COMP *in_stack_ffffffffffffff70;
  AV1_COMP *cpi_00;
  int local_88;
  BLOCK_SIZE local_81;
  PICK_MODE_CONTEXT *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int iVar5;
  int in_stack_ffffffffffffff9c;
  int iVar6;
  undefined1 in_stack_ffffffffffffffa0 [16];
  int in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  
  memcpy(&stack0xffffffffffffff94,(void *)(in_stack_00000010 + 8),0x2c);
  pt_cost_00 = (int *)(in_stack_00000010 + 0x58);
  local_81 = (BLOCK_SIZE)in_stack_ffffffffffffffbc;
  if ((*(int *)(in_stack_00000010 + 0x118) == 0) && (*(int *)(in_stack_00000010 + 0x11c) != 0)) {
    local_88 = 0;
    iVar5 = in_stack_ffffffffffffff98;
    iVar6 = in_stack_ffffffffffffff9c;
    av1_invalid_rd_stats((RD_STATS *)&stack0xffffffffffffff50);
    uVar3 = (undefined4)((ulong)&local_88 >> 0x20);
    pvVar2 = in_stack_00000018;
    set_none_partition_params
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (PC_TREE *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,
               (RD_STATS *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (RD_STATS *)CONCAT44(in_stack_ffffffffffffff98,in_stack_ffffffffffffff9c),pt_cost_00)
    ;
    uVar4 = CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    xd = (MACROBLOCKD *)CONCAT44(uVar3,(uint)local_81);
    part_state = (PartitionSearchState *)((ulong)pvVar2 & 0xffffffff00000000);
    best_rd.zero_rate = iVar6;
    best_rd.rate = iVar5;
    best_rd.dist = in_stack_ffffffffffffffa0._0_8_;
    best_rd.rdcost = in_stack_ffffffffffffffa0._8_8_;
    best_rd.sse._0_4_ = in_stack_ffffffffffffffb0;
    best_rd._28_8_ = in_stack_ffffffffffffffb4;
    best_rd._36_4_ = in_stack_ffffffffffffffbc;
    sms_tree_00 = in_stack_ffffffffffffff60;
    x_00 = in_stack_ffffffffffffff68;
    cpi_00 = in_stack_ffffffffffffff70;
    pick_sb_modes(in_stack_ffffffffffffff70,(TileDataEnc *)in_stack_ffffffffffffff68,
                  in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                  (RD_STATS *)in_stack_ffffffffffffff50,(PARTITION_TYPE)in_stack_ffffffffffffff9c,
                  (BLOCK_SIZE)pt_cost_00,in_stack_ffffffffffffff90,best_rd);
    av1_rd_cost_update((int)((ulong)xd >> 0x20),(RD_STATS *)part_state);
    *(uint *)&in_stack_00000020->intra_part_info = in_RCX->source_variance;
    if (in_stack_00000028 != (undefined8 *)0x0) {
      *in_stack_00000028 = *(undefined8 *)(pt_cost_00 + 4);
    }
    *(undefined8 *)(in_stack_00000010 + 0xc0) = *(undefined8 *)(pt_cost_00 + 4);
    if (*pt_cost_00 != 0x7fffffff) {
      if (*(int *)(in_RDI + 0x60a94) != 0) {
        iVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)part_state);
        in_stack_ffffffffffffff4c = (int)iVar1;
        av1_update_picked_ref_frames_mask
                  (in_RCX,in_stack_ffffffffffffff4c,local_81,
                   *(int *)(*(long *)(in_RDI + 0x42008) + 0x20),in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff9c);
      }
      if (in_stack_ffffffffffffffb0 != 0) {
        *pt_cost_00 = local_88 + *pt_cost_00;
        *(long *)(pt_cost_00 + 4) =
             ((long)*pt_cost_00 * (long)in_RCX->rdmult + 0x100 >> 9) +
             *(long *)(pt_cost_00 + 2) * 0x80;
      }
      *in_stack_00000030 = *(undefined8 *)(pt_cost_00 + 4);
      if (*(long *)(pt_cost_00 + 4) < *(long *)((long)in_stack_00000018 + 0x10)) {
        memcpy(in_stack_00000018,pt_cost_00,0x28);
        *(undefined1 *)(in_stack_00000010 + 0x144) = 1;
        if (in_stack_ffffffffffffffb0 != 0) {
          *in_R8 = 0;
        }
        prune_partitions_after_none
                  (cpi_00,&x_00->mb,(SIMPLE_MOTION_DATA_TREE *)sms_tree_00,
                   (PICK_MODE_CONTEXT *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff50,
                   (RD_STATS *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (uint *)CONCAT44(in_stack_ffffffffffffff98,in_stack_ffffffffffffff9c));
        part_state = in_stack_00000020;
      }
      if ((*(byte *)(in_RDI + 0x609c1) & 1) != 0) {
        prune_rect_part_using_none_pred_mode(xd,part_state,'\0',BLOCK_4X4);
      }
    }
    av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    av1_restore_context((MACROBLOCK *)in_stack_ffffffffffffff70,
                        (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_ffffffffffffff68,
                        (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (int)in_stack_ffffffffffffff60,(BLOCK_SIZE)((ulong)uVar4 >> 0x38),(int)uVar4
                       );
  }
  return;
}

Assistant:

static void none_partition_search(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data, MACROBLOCK *x,
    PC_TREE *pc_tree, SIMPLE_MOTION_DATA_TREE *sms_tree,
    RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    unsigned int *pb_source_variance, int64_t *none_rd, int64_t *part_none_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  RD_STATS *this_rdc = &part_search_state->this_rdc;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;
  assert(bsize < BLOCK_SIZES_ALL);

  if (part_search_state->terminate_partition_search ||
      !part_search_state->partition_none_allowed)
    return;

  int pt_cost = 0;
  RD_STATS best_remain_rdcost;
  av1_invalid_rd_stats(&best_remain_rdcost);

  // Set PARTITION_NONE context and cost.
  set_none_partition_params(cpi, td, x, pc_tree, part_search_state,
                            &best_remain_rdcost, best_rdc, &pt_cost);

#if CONFIG_COLLECT_PARTITION_STATS
  // Timer start for partition None.
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  if (best_remain_rdcost.rdcost >= 0) {
    start_partition_block_timer(part_timing_stats, PARTITION_NONE);
  }
#endif
  // PARTITION_NONE evaluation and cost update.
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, this_rdc, PARTITION_NONE,
                bsize, pc_tree->none, best_remain_rdcost);

  av1_rd_cost_update(x->rdmult, this_rdc);

#if CONFIG_COLLECT_PARTITION_STATS
  // Timer end for partition None.
  if (part_timing_stats->timer_is_on) {
    RD_STATS tmp_rdc;
    av1_init_rd_stats(&tmp_rdc);
    if (this_rdc->rate != INT_MAX) {
      tmp_rdc.rate = this_rdc->rate;
      tmp_rdc.dist = this_rdc->dist;
      tmp_rdc.rdcost = this_rdc->rdcost;
      if (blk_params.bsize_at_least_8x8) {
        tmp_rdc.rate += pt_cost;
        tmp_rdc.rdcost = RDCOST(x->rdmult, tmp_rdc.rate, tmp_rdc.dist);
      }
    }
    end_partition_block_timer(part_timing_stats, PARTITION_NONE,
                              tmp_rdc.rdcost);
  }
#endif
  *pb_source_variance = x->source_variance;
  if (none_rd) *none_rd = this_rdc->rdcost;
  part_search_state->none_rd = this_rdc->rdcost;
  if (this_rdc->rate != INT_MAX) {
    // Record picked ref frame to prune ref frames for other partition types.
    if (cpi->sf.inter_sf.prune_ref_frame_for_rect_partitions) {
      const int ref_type = av1_ref_frame_type(pc_tree->none->mic.ref_frame);
      av1_update_picked_ref_frames_mask(
          x, ref_type, bsize, cm->seq_params->mib_size, mi_row, mi_col);
    }

    // Calculate the total cost and update the best partition.
    if (blk_params.bsize_at_least_8x8) {
      this_rdc->rate += pt_cost;
      this_rdc->rdcost = RDCOST(x->rdmult, this_rdc->rate, this_rdc->dist);
    }
    *part_none_rd = this_rdc->rdcost;
    if (this_rdc->rdcost < best_rdc->rdcost) {
      *best_rdc = *this_rdc;
      part_search_state->found_best_partition = true;
      if (blk_params.bsize_at_least_8x8) {
        pc_tree->partitioning = PARTITION_NONE;
      }

      // Disable split and rectangular partition search
      // based on PARTITION_NONE cost.
      prune_partitions_after_none(cpi, x, sms_tree, pc_tree->none,
                                  part_search_state, best_rdc,
                                  pb_source_variance);
    }

    if (cpi->sf.part_sf.prune_rect_part_using_none_pred_mode)
      prune_rect_part_using_none_pred_mode(&x->e_mbd, part_search_state,
                                           pc_tree->none->mic.mode, bsize);
  }
  av1_restore_context(x, x_ctx, mi_row, mi_col, bsize, av1_num_planes(cm));
}